

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> * __thiscall
vkb::PhysicalDeviceSelector::select_devices
          (Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>
           *__return_storage_ptr__,PhysicalDeviceSelector *this)

{
  bool bVar1;
  Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> selected_devices;
  anon_union_24_2_293c120a_for_Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_>_1
  local_38;
  char local_20;
  
  select_impl((Result<std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>_> *)
              &local_38.m_value,this);
  if (local_20 != '\0') {
    if (local_38.m_value.
        super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pointer)CONCAT44(local_38._4_4_,local_38.m_error.type._M_value)) {
      bVar1 = true;
      std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::vector
                ((vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_> *)
                 __return_storage_ptr__,&local_38.m_value);
      goto LAB_0013370f;
    }
    local_38.m_value.super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)&detail::physical_device_error_category;
    local_38.m_error.type._M_value = 3;
  }
  (__return_storage_ptr__->field_0).m_error.type._M_value = local_38.m_error.type._M_value;
  (__return_storage_ptr__->field_0).m_value.
  super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.m_value.
       super__Vector_base<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
  bVar1 = false;
LAB_0013370f:
  __return_storage_ptr__->m_init = bVar1;
  if (local_20 == '\x01') {
    std::vector<vkb::PhysicalDevice,_std::allocator<vkb::PhysicalDevice>_>::~vector
              (&local_38.m_value);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<PhysicalDevice>> PhysicalDeviceSelector::select_devices() const {
    auto const selected_devices = select_impl();
    if (!selected_devices) return Result<std::vector<PhysicalDevice>>{ selected_devices.error() };
    if (selected_devices.value().size() == 0) {
        return Result<std::vector<PhysicalDevice>>{ PhysicalDeviceError::no_suitable_device };
    }
    return selected_devices.value();
}